

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  Select *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vdbe *p_01;
  CollSeq *pCVar4;
  Expr *pEVar5;
  char *pcVar6;
  int local_13c;
  KeyInfo *local_128;
  int local_11c;
  Expr *pLimit;
  undefined1 local_f8 [4];
  int nReg;
  SelectDest dest_1;
  Select *pSel;
  Expr *pEStack_c8;
  int iValToIns;
  Expr *pE2;
  int local_b8;
  int r3;
  int r2;
  int r1;
  ExprList_item *pItem;
  ExprList *pList;
  int i_1;
  char affinity;
  Expr *p;
  undefined1 local_88 [4];
  int i;
  SelectDest dest;
  ExprList *pEList;
  Select *pSelect;
  int nVal;
  KeyInfo *pKeyInfo;
  Expr *pLeft;
  int addr;
  Vdbe *v;
  int rReg;
  int jmpIfDynamic;
  int isRowid_local;
  int rHasNullFlag_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  v._4_4_ = -1;
  v._0_4_ = 0;
  p_01 = sqlite3GetVdbe(pParse);
  if (p_01 == (Vdbe *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
    if ((pExpr->flags & 0x20) == 0) {
      v._4_4_ = sqlite3VdbeAddOp0(p_01,0x11);
    }
    if ((pExpr->op == '\x14') || (pExpr->op != '1')) {
      dest_1.pOrderBy = (pExpr->x).pList;
      pcVar6 = "CORRELATED ";
      if (-1 < v._4_4_) {
        pcVar6 = "";
      }
      sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY",pcVar6);
      if (pExpr->op == '\x7f') {
        local_13c = **(int **)dest_1.pOrderBy;
      }
      else {
        local_13c = 1;
      }
      sqlite3SelectDestInit((SelectDest *)local_f8,0,pParse->nMem + 1);
      pParse->nMem = local_13c + pParse->nMem;
      if (pExpr->op == '\x7f') {
        local_f8[0] = '\n';
        dest_1._0_4_ = nReg;
        dest_1.iSDParm = local_13c;
        sqlite3VdbeAddOp3(p_01,0x49,0,nReg,nReg + local_13c + -1);
      }
      else {
        local_f8[0] = '\x03';
        sqlite3VdbeAddOp2(p_01,0x46,0,nReg);
      }
      pEVar5 = sqlite3ExprAlloc(pParse->db,0x8f,sqlite3IntTokens + 1,0);
      if (dest_1.pOrderBy[2].a[0].zName == (char *)0x0) {
        pEVar5 = sqlite3PExpr(pParse,0x89,pEVar5,(Expr *)0x0);
        dest_1.pOrderBy[2].a[0].zName = (char *)pEVar5;
      }
      else {
        sqlite3ExprDelete(pParse->db,*(Expr **)(dest_1.pOrderBy[2].a[0].zName + 0x10));
        *(Expr **)(dest_1.pOrderBy[2].a[0].zName + 0x10) = pEVar5;
      }
      *(undefined4 *)&(dest_1.pOrderBy)->a[0].zName = 0;
      iVar3 = sqlite3Select(pParse,(Select *)dest_1.pOrderBy,(SelectDest *)local_f8);
      if (iVar3 != 0) {
        return 0;
      }
      v._0_4_ = nReg;
    }
    else {
      pEVar5 = pExpr->pLeft;
      iVar1 = sqlite3ExprVectorSize(pEVar5);
      iVar3 = pParse->nTab;
      pParse->nTab = iVar3 + 1;
      pExpr->iTable = iVar3;
      local_11c = iVar1;
      if (isRowid != 0) {
        local_11c = 0;
      }
      iVar3 = sqlite3VdbeAddOp2(p_01,0x71,pExpr->iTable,local_11c);
      if (isRowid == 0) {
        local_128 = sqlite3KeyInfoAlloc(pParse->db,iVar1,1);
      }
      else {
        local_128 = (KeyInfo *)0x0;
      }
      if ((pExpr->flags & 0x800) == 0) {
        if ((pExpr->x).pList != (ExprList *)0x0) {
          pItem = (ExprList_item *)(pExpr->x).pList;
          pList._7_1_ = sqlite3ExprAffinity(pEVar5);
          if (pList._7_1_ == '\0') {
            pList._7_1_ = 'A';
          }
          if (local_128 != (KeyInfo *)0x0) {
            pCVar4 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
            local_128->aColl[0] = pCVar4;
          }
          r3 = sqlite3GetTempReg(pParse);
          local_b8 = sqlite3GetTempReg(pParse);
          if (isRowid != 0) {
            sqlite3VdbeAddOp4(p_01,0x4b,0,local_b8,0,"",-1);
          }
          _r2 = &pItem->zName;
          for (pList._0_4_ = *(int *)&pItem->pExpr; 0 < (int)pList; pList._0_4_ = (int)pList + -1) {
            pEStack_c8 = (Expr *)*_r2;
            if ((-1 < v._4_4_) && (iVar1 = sqlite3ExprIsConstant(pEStack_c8), iVar1 == 0)) {
              sqlite3VdbeChangeToNoop(p_01,v._4_4_);
              v._4_4_ = -1;
            }
            if ((isRowid == 0) ||
               (iVar1 = sqlite3ExprIsInteger(pEStack_c8,(int *)((long)&pSel + 4)), iVar1 == 0)) {
              iVar1 = sqlite3ExprCodeTarget(pParse,pEStack_c8,r3);
              pE2._4_4_ = iVar1;
              if (isRowid == 0) {
                sqlite3VdbeAddOp4(p_01,0x66,iVar1,1,local_b8,(char *)((long)&pList + 7),1);
                sqlite3VdbeAddOp4Int(p_01,0x85,pExpr->iTable,local_b8,pE2._4_4_,1);
              }
              else {
                iVar2 = sqlite3VdbeCurrentAddr(p_01);
                sqlite3VdbeAddOp2(p_01,0xf,iVar1,iVar2 + 2);
                sqlite3VdbeAddOp3(p_01,0x7a,pExpr->iTable,local_b8,pE2._4_4_);
              }
            }
            else {
              sqlite3VdbeAddOp3(p_01,0x7b,pExpr->iTable,local_b8,pSel._4_4_);
            }
            _r2 = _r2 + 4;
          }
          sqlite3ReleaseTempReg(pParse,r3);
          sqlite3ReleaseTempReg(pParse,local_b8);
        }
      }
      else {
        p_00 = (pExpr->x).pSelect;
        dest.pOrderBy = p_00->pEList;
        pcVar6 = "CORRELATED ";
        if (-1 < v._4_4_) {
          pcVar6 = "";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY",pcVar6);
        if ((dest.pOrderBy)->nExpr == iVar1) {
          sqlite3SelectDestInit((SelectDest *)local_88,0xb,pExpr->iTable);
          dest._8_8_ = exprINAffinity(pParse,pExpr);
          p_00->iLimit = 0;
          iVar2 = sqlite3Select(pParse,p_00,(SelectDest *)local_88);
          if (iVar2 != 0) {
            sqlite3DbFree(pParse->db,(void *)dest._8_8_);
            sqlite3KeyInfoUnref(local_128);
            return 0;
          }
          sqlite3DbFree(pParse->db,(void *)dest._8_8_);
          for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
            _i_1 = sqlite3VectorFieldSubexpr(pEVar5,p._4_4_);
            pCVar4 = sqlite3BinaryCompareCollSeq(pParse,_i_1,(dest.pOrderBy)->a[p._4_4_].pExpr);
            local_128->aColl[p._4_4_] = pCVar4;
          }
        }
      }
      if (local_128 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(p_01,iVar3,(char *)local_128,-9);
      }
    }
    if (rHasNullFlag != 0) {
      sqlite3SetHasNullFlag(p_01,pExpr->iTable,rHasNullFlag);
    }
    if (-1 < v._4_4_) {
      sqlite3VdbeJumpHere(p_01,v._4_4_);
    }
    pParse_local._4_4_ = (int)v;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "
        ));
        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;
        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp4(v, OP_Blob, 0, r2, 0, "", P4_STATIC);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */
      Expr *pLimit;                         /* New limit expression */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "));
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
      if( pSel->pLimit ){
        sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
        pSel->pLimit->pLeft = pLimit;
      }else{
        pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
      }
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }

  return rReg;
}